

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.hxx
# Opt level: O0

string * __thiscall
cmsys::RegularExpression::match_abi_cxx11_
          (string *__return_storage_ptr__,RegularExpression *this,int n)

{
  int n_local;
  RegularExpression *this_local;
  
  RegularExpressionMatch::match_abi_cxx11_(__return_storage_ptr__,&this->regmatch,n);
  return __return_storage_ptr__;
}

Assistant:

inline std::string RegularExpression::match(int n) const
{
  return regmatch.match(n);
}